

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O2

int rops_close_kill_connection_ws(lws *wsi,lws_close_status reason)

{
  lws_h2_protocol_send *plVar1;
  char *ptr;
  int iVar2;
  ulong uVar3;
  lws_h2_protocol_send *__ptr;
  undefined8 in_R8;
  undefined8 in_R9;
  lws_role_ops *plVar4;
  
  if ((~*(uint *)&wsi->field_0x2dc & 0x12) != 0) {
    return 0;
  }
  plVar4 = &role_ops_h2;
  if ((~*(uint *)&wsi->field_0x2dc & 0x12) == 0) {
    lws_h2_rst_stream(wsi,0,"none");
  }
  _lws_log(8," wsi: %p, his parent %p: siblings:\n",wsi,(wsi->mux).parent_wsi,in_R8,in_R9,plVar4);
  lws_wsi_mux_dump_children(wsi);
  uVar3 = *(ulong *)&wsi->field_0x2dc;
  if ((uVar3 & 0x80000000000006) != 0) {
    _lws_log(8,"closing %p: parent %p\n",wsi,(wsi->mux).parent_wsi,in_R8,in_R9,plVar4);
    if (((wsi->mux).child_list != (lws *)0x0) && (iVar2 = lwsl_visible(8), iVar2 != 0)) {
      _lws_log(8," parent %p: closing children: list:\n",wsi);
      lws_wsi_mux_dump_children(wsi);
    }
    lws_wsi_mux_close_children(wsi,reason);
    uVar3 = *(ulong *)&wsi->field_0x2dc;
  }
  if ((uVar3 & 4) != 0) {
    __ptr = ((wsi->h2).h2n)->pps;
    while (__ptr != (lws_h2_protocol_send *)0x0) {
      plVar1 = __ptr->next;
      free(__ptr);
      __ptr = plVar1;
    }
    ((wsi->h2).h2n)->pps = (lws_h2_protocol_send *)0x0;
    uVar3 = *(ulong *)&wsi->field_0x2dc;
  }
  if (((uVar3 & 0x80000000000002) != 0) && ((wsi->mux).parent_wsi != (lws *)0x0)) {
    lws_wsi_mux_sibling_disconnect(wsi);
    ptr = (wsi->h2).pending_status_body;
    if (ptr != (char *)0x0) {
      lws_realloc(ptr,0,"free");
      (wsi->h2).pending_status_body = (char *)0x0;
    }
  }
  return 0;
}

Assistant:

static int
rops_close_kill_connection_ws(struct lws *wsi, enum lws_close_status reason)
{
	/* deal with ws encapsulation in h2 */
#if defined(LWS_WITH_HTTP2)
	if (wsi->mux_substream && wsi->h2_stream_carries_ws)
		return role_ops_h2.close_kill_connection(wsi, reason);

	return 0;
#else
	return 0;
#endif
}